

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Table_Decompose_Test::TestBody(Table_Decompose_Test *this)

{
  uint uVar1;
  ushort uVar2;
  char cVar3;
  size_t sVar4;
  DecomposeType *pDVar5;
  ulong uVar6;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_04;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_07;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  __m128i match;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  AssertionResult AVar14;
  type raw;
  int expected_constructed;
  char *three_p;
  DecomposeType elem;
  int one;
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
  set1;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  DecomposeType local_6c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  InsertSlot<true> *local_60;
  AssertHelper local_58;
  undefined1 local_4c [4];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  _Head_base<0UL,_unsigned_long,_false> local_20;
  
  local_4c = (undefined1  [4])0x1;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18163b;
  local_20._M_head_impl = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  (anonymous_namespace)::decompose_constructed = 0;
  local_6c.i = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i,
             &(anonymous_namespace)::decompose_constructed);
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)local_90);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x275,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_88 + 8),local_80);
  }
  if ((ctrl_t *)local_48._0_8_ != (ctrl_t *)0x0) {
    if ((local_38._8_8_ + 1 & local_38._8_8_) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar6 = (ulong)local_48._0_8_ >> 0xc;
    lVar8 = 0;
    while( true ) {
      uVar6 = uVar6 & local_38._8_8_;
      pcVar9 = (char *)(local_48._0_8_ + uVar6);
      cVar3 = pcVar9[0xf];
      auVar13[0] = -(*pcVar9 == '\0');
      auVar13[1] = -(pcVar9[1] == '\0');
      auVar13[2] = -(pcVar9[2] == '\0');
      auVar13[3] = -(pcVar9[3] == '\0');
      auVar13[4] = -(pcVar9[4] == '\0');
      auVar13[5] = -(pcVar9[5] == '\0');
      auVar13[6] = -(pcVar9[6] == '\0');
      auVar13[7] = -(pcVar9[7] == '\0');
      auVar13[8] = -(pcVar9[8] == '\0');
      auVar13[9] = -(pcVar9[9] == '\0');
      auVar13[10] = -(pcVar9[10] == '\0');
      auVar13[0xb] = -(pcVar9[0xb] == '\0');
      auVar13[0xc] = -(pcVar9[0xc] == '\0');
      auVar13[0xd] = -(pcVar9[0xd] == '\0');
      auVar13[0xe] = -(pcVar9[0xe] == '\0');
      auVar13[0xf] = -(cVar3 == '\0');
      uVar2 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
      if (uVar2 != 0) {
        uVar10 = (uint)uVar2;
        do {
          uVar1 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
            }
          }
          uVar11 = uVar1 + uVar6 & local_38._8_8_;
          if (((slot_type *)(local_48._8_8_ + uVar11 * 4))->i == 0) {
            if (uVar11 == 0xffffffffffffffff) goto LAB_00122f8d;
            goto LAB_00122fd2;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      auVar12[0] = -(*pcVar9 == -0x80);
      auVar12[1] = -(pcVar9[1] == -0x80);
      auVar12[2] = -(pcVar9[2] == -0x80);
      auVar12[3] = -(pcVar9[3] == -0x80);
      auVar12[4] = -(pcVar9[4] == -0x80);
      auVar12[5] = -(pcVar9[5] == -0x80);
      auVar12[6] = -(pcVar9[6] == -0x80);
      auVar12[7] = -(pcVar9[7] == -0x80);
      auVar12[8] = -(pcVar9[8] == -0x80);
      auVar12[9] = -(pcVar9[9] == -0x80);
      auVar12[10] = -(pcVar9[10] == -0x80);
      auVar12[0xb] = -(pcVar9[0xb] == -0x80);
      auVar12[0xc] = -(pcVar9[0xc] == -0x80);
      auVar12[0xd] = -(pcVar9[0xd] == -0x80);
      auVar12[0xe] = -(pcVar9[0xe] == -0x80);
      auVar12[0xf] = -(cVar3 == -0x80);
      if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80)
      break;
      uVar6 = uVar6 + lVar8 + 0x10;
      lVar8 = lVar8 + 0x10;
    }
  }
LAB_00122f8d:
  sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
          ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                            *)local_48,0);
  ((slot_type *)(local_48._8_8_ + sVar4 * 4))->i = 0;
  if (sVar4 < (ulong)local_38._8_8_) {
    *(ctrl_t *)(local_48._0_8_ + sVar4) = '\0';
    *(ctrl_t *)
     (local_48._0_8_ + (ulong)(local_38._8_4_ & 0xf) + 1 + (sVar4 - 0x10 & local_38._8_8_)) = '\0';
LAB_00122fd2:
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x277;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x277,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_90._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_90,
               &pDVar5->i);
    local_6c.i = local_6c.i + 1;
    AVar14 = testing::internal::CmpHelperEQ<int,int>
                       ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
                        &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar14.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x279,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      _Var7 = extraout_RDX.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
        _Var7._M_head_impl = extraout_RDX_00;
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::emplace<const_char_(&)[2],_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)local_48,(char (*) [2])_Var7._M_head_impl);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27b,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x27c;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_90._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_90,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x280;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x280,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x285;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x285,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_90._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_90,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28a;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28a,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28f;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28f,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_90._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_90,
               &pDVar5->i);
    AVar14 = testing::internal::CmpHelperEQ<int,int>
                       ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",
                        &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar14.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x294,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      _Var7 = extraout_RDX_02.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
        _Var7._M_head_impl = extraout_RDX_03;
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_04.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::emplace<const_char_(&)[2],_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)local_48,(char (*) [2])_Var7._M_head_impl);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x297;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x297,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x299,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::emplace<const_char_*const_&,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)local_48,(char **)&local_68);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x29c;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x29c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_90._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_90,
               &pDVar5->i);
    AVar14 = testing::internal::CmpHelperEQ<int,int>
                       ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",
                        &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar14.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a1,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      _Var7 = extraout_RDX_05.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
        _Var7._M_head_impl = extraout_RDX_06;
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_07.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::emplace<const_char_(&)[2],_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)local_48,(char (*) [2])_Var7._M_head_impl);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a4;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a4,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a6,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::emplace<const_char_*const_&,_0>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)local_48,(char **)&local_68);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_90);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a9,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::~raw_hash_set((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                     *)local_48);
    local_58.data_._0_4_ = 0;
    local_4c = (undefined1  [4])0x1;
    local_20._M_head_impl = 0;
    local_48 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    (anonymous_namespace)::decompose_constructed = 0;
    local_6c.i = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x275,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
            ::_find_key<phmap::priv::(anonymous_namespace)::DecomposeType>
                      ((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                        *)local_48,(DecomposeType *)&local_58,0);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
              ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                                *)local_48,0);
      ((slot_type *)(local_48._8_8_ + sVar4 * 4))->i = 0;
      if ((ulong)local_38._8_8_ <= sVar4) {
        pcVar9 = 
        "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
        ;
        goto LAB_00126309;
      }
      *(ctrl_t *)(local_48._0_8_ + sVar4) = '\0';
      *(ctrl_t *)
       (local_48._0_8_ + (ulong)(local_38._8_4_ & 0xf) + 1 + (sVar4 - 0x10 & local_38._8_8_)) = '\0'
      ;
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x277;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x277,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &pDVar5->i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x279;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x279,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27b,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x27c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x280;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x280,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x285;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x285,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28a;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28a,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28f;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x294;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x294,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x297;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x297,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x299;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x299,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x29c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x29c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a1;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a1,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a4;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a4,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a6;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a9,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::~raw_hash_set((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                     *)local_48);
    local_58.data_._0_4_ = 0;
    local_4c = (undefined1  [4])0x1;
    local_20._M_head_impl = 0;
    local_48 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    (anonymous_namespace)::decompose_constructed = 0;
    local_6c.i = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x275,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
            ::_find_key<phmap::priv::(anonymous_namespace)::DecomposeType>
                      ((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
                        *)local_48,(DecomposeType *)&local_58,0);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
              ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
                                *)local_48,0);
      ((slot_type *)(local_48._8_8_ + sVar4 * 4))->i = 0;
      if ((ulong)local_38._8_8_ <= sVar4) {
        pcVar9 = 
        "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, TransparentEqIntOverload, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = TransparentEqIntOverload, Alloc = std::allocator<int>]"
        ;
        goto LAB_00126309;
      }
      *(ctrl_t *)(local_48._0_8_ + sVar4) = '\0';
      *(ctrl_t *)
       (local_48._0_8_ + (ulong)(local_38._8_4_ & 0xf) + 1 + (sVar4 - 0x10 & local_38._8_8_)) = '\0'
      ;
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x277;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x277,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &pDVar5->i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x279;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x279,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27b,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x27c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x280;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x280,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x285;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x285,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28a;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28a,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28f;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x294;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x294,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x297;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x297,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x299;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x299,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x29c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x29c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a1;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a1,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a4;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a4,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a6;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentHashIntOverload,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a9,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
    ::~raw_hash_set((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
                     *)local_48);
    local_58.data_._0_4_ = 0;
    local_4c = (undefined1  [4])0x1;
    local_20._M_head_impl = 0;
    local_48 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    (anonymous_namespace)::decompose_constructed = 0;
    local_6c.i = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x275,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
            ::_find_key<phmap::priv::(anonymous_namespace)::DecomposeType>
                      ((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
                        *)local_48,(DecomposeType *)&local_58,0);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
              ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
                                *)local_48,0);
      ((slot_type *)(local_48._8_8_ + sVar4 * 4))->i = 0;
      if ((ulong)local_38._8_8_ <= sVar4) {
        pcVar9 = 
        "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, phmap::priv::(anonymous namespace)::DecomposeHash, TransparentEqIntOverload, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = phmap::priv::(anonymous namespace)::DecomposeHash, Eq = TransparentEqIntOverload, Alloc = std::allocator<int>]"
        ;
        goto LAB_00126309;
      }
      *(ctrl_t *)(local_48._0_8_ + sVar4) = '\0';
      *(ctrl_t *)
       (local_48._0_8_ + (ulong)(local_38._8_4_ & 0xf) + 1 + (sVar4 - 0x10 & local_38._8_8_)) = '\0'
      ;
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x277;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x277,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &pDVar5->i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x279;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x279,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"++expected_constructed","decompose_constructed",
               &local_6c.i,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27b,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x27c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x27c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x280;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x280,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x285;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x285,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28a;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28a,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x28f;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x28f,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x294;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x294,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x297;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x297,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x299;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x299,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x29c;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x29c,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    local_68._M_head_impl._0_4_ = 1;
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)&local_68,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a1;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a1,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    pDVar5 = &local_6c;
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a4;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a4,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::DecomposePolicy::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::EmplaceDecomposable,int>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),(DecomposePolicy *)local_48,(EmplaceDecomposable *)local_4c,
               &pDVar5->i);
    pDVar5 = &local_6c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&pDVar5->i,
               &(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      pDVar5 = (DecomposeType *)0x2a6;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    (anonymous_namespace)::decompose_constructed = (anonymous_namespace)::decompose_constructed + 1;
    local_90._0_4_ = 0x33;
    local_68._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_60 = (InsertSlot<true> *)local_90;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void>::
    apply<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::Table_Decompose_Test::TestBody()::TransparentEqIntOverload,std::allocator<int>>::InsertSlot<true>,phmap::priv::(anonymous_namespace)::DecomposeType_const&,phmap::priv::(anonymous_namespace)::DecomposePolicy>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>::iterator,_bool>
                *)(local_90 + 8),
               (hash_policy_traits<phmap::priv::(anonymous_namespace)::DecomposePolicy,void> *)
               &local_68,(InsertSlot<true> *)local_90,pDVar5);
    local_6c.i = local_6c.i + 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(local_90 + 8),"expected_constructed","decompose_constructed",&local_6c.i
               ,&(anonymous_namespace)::decompose_constructed);
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)&local_68);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x2a9,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),local_80);
    }
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
    ::~raw_hash_set((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
                     *)local_48);
    return;
  }
  pcVar9 = 
  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, phmap::priv::(anonymous namespace)::DecomposeHash, phmap::priv::(anonymous namespace)::DecomposeEq, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = phmap::priv::(anonymous namespace)::DecomposeHash, Eq = phmap::priv::(anonymous namespace)::DecomposeEq, Alloc = std::allocator<int>]"
  ;
LAB_00126309:
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,pcVar9);
}

Assistant:

void TestDecompose(bool construct_three) {
  DecomposeType elem{0};
  const int one = 1;
  const char* three_p = "3";
  const auto& three = three_p;

  raw_hash_set<DecomposePolicy, Hash, Eq, std::allocator<int>> set1;

  decompose_constructed = 0;
  int expected_constructed = 0;
  EXPECT_EQ(expected_constructed, decompose_constructed);
  set1.insert(elem);
  EXPECT_EQ(expected_constructed, decompose_constructed);
  set1.insert(1);
  EXPECT_EQ(++expected_constructed, decompose_constructed);
  set1.emplace("3");
  EXPECT_EQ(++expected_constructed, decompose_constructed);
  EXPECT_EQ(expected_constructed, decompose_constructed);

  {  // insert(T&&)
    set1.insert(1);
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }

  {  // insert(const T&)
    set1.insert(one);
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }

  {  // insert(hint, T&&)
    set1.insert(set1.begin(), 1);
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }

  {  // insert(hint, const T&)
    set1.insert(set1.begin(), one);
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }

  {  // emplace(...)
    set1.emplace(1);
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace("3");
    expected_constructed += construct_three;
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace(one);
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace(three);
    expected_constructed += construct_three;
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }

  {  // emplace_hint(...)
    set1.emplace_hint(set1.begin(), 1);
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace_hint(set1.begin(), "3");
    expected_constructed += construct_three;
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace_hint(set1.begin(), one);
    EXPECT_EQ(expected_constructed, decompose_constructed);
    set1.emplace_hint(set1.begin(), three);
    expected_constructed += construct_three;
    EXPECT_EQ(expected_constructed, decompose_constructed);
  }
}